

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O2

void __thiscall Maze::startCellEndCells(Maze *this)

{
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *this_00;
  tuple<int,_int> *ptVar1;
  _Head_base<0UL,_int,_false> *p_Var2;
  tuple<int,_int> *ptVar3;
  _Head_base<0UL,_int,_false> *p_Var4;
  uint uVar5;
  int iVar6;
  _Head_base<0UL,_int,_false> *p_Var7;
  tuple<int,_int> *ptVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  bool bVar12;
  bool bVar13;
  ulong uVar14;
  
  this_00 = &this->MazeMatrix;
  ptVar1 = &this->startCell;
  p_Var2 = &(this->startCell).super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>;
  ptVar3 = &this->endCell;
  p_Var4 = &(this->endCell).super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>;
  bVar12 = false;
  for (uVar14 = 0;
      uVar14 < (ulong)(((long)(this->MazeMatrix).
                              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->MazeMatrix).
                             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar14 = uVar14 + 1
      ) {
    pvVar9 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(this_00,uVar14);
    pvVar10 = std::vector<char,_std::allocator<char>_>::at(pvVar9,0);
    if (*pvVar10 == '0') {
      p_Var7 = p_Var4;
      ptVar8 = ptVar3;
      if (!bVar12) {
        bVar12 = true;
        p_Var7 = p_Var2;
        ptVar8 = ptVar1;
      }
      p_Var7->_M_head_impl = (int)uVar14;
      (ptVar8->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl = 0;
    }
    pvVar9 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(this_00,uVar14);
    pvVar11 = std::
              vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              ::at(this_00,uVar14);
    pvVar10 = std::vector<char,_std::allocator<char>_>::at
                        (pvVar9,(size_type)
                                ((pvVar11->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_finish +
                                ~(ulong)(pvVar11->super__Vector_base<char,_std::allocator<char>_>).
                                        _M_impl.super__Vector_impl_data._M_start));
    if (*pvVar10 == '0') {
      pvVar9 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::at(this_00,uVar14);
      uVar5 = *(uint *)&(pvVar9->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start;
      iVar6 = *(int *)&(pvVar9->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
      p_Var7 = p_Var4;
      ptVar8 = ptVar3;
      if (bVar12 == false) {
        bVar12 = true;
        p_Var7 = p_Var2;
        ptVar8 = ptVar1;
      }
      p_Var7->_M_head_impl = (int)uVar14;
      (ptVar8->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl = ~uVar5 + iVar6;
    }
  }
  for (uVar14 = 0;
      pvVar9 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::at(this_00,0),
      uVar14 < (ulong)((long)(pvVar9->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pvVar9->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                            super__Vector_impl_data._M_start); uVar14 = uVar14 + 1) {
    pvVar9 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(this_00,0);
    pvVar10 = std::vector<char,_std::allocator<char>_>::at(pvVar9,uVar14);
    if (*pvVar10 == '0') {
      p_Var7 = p_Var4;
      ptVar8 = ptVar3;
      if (bVar12 == false) {
        bVar12 = true;
        p_Var7 = p_Var2;
        ptVar8 = ptVar1;
      }
      p_Var7->_M_head_impl = 0;
      (ptVar8->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl = (int)uVar14;
    }
    pvVar9 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::at(this_00,((long)(this->MazeMatrix).
                                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->MazeMatrix).
                                super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 1);
    pvVar10 = std::vector<char,_std::allocator<char>_>::at(pvVar9,uVar14);
    if (*pvVar10 == '0') {
      bVar13 = bVar12;
      if (bVar12 == false) {
        bVar13 = true;
      }
      (&this->startCell)[bVar12].super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
      _M_head_impl = (int)(((long)(this->MazeMatrix).
                                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->MazeMatrix).
                                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18) + -1;
      (&this->startCell)[bVar12].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl = (int)uVar14;
      bVar12 = bVar13;
    }
  }
  return;
}

Assistant:

void Maze::startCellEndCells() {
//looks for the start cell and the end cell.
//scans the edges, and picks the first one it comes accoss as the start cell. The next one
// would be the ending cell.


    bool startFound = false;
    for(int i = 0; i < MazeMatrix.size(); i++)
    {
        if(MazeMatrix.at(i).at(0) == '0'){
            if(!startFound){
                startCell = std::make_tuple (i,0);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(i,0);
            }
        }
        if(MazeMatrix.at(i).at(MazeMatrix.at(i).size()-1) == '0'){
            if(!startFound){
                startCell = std::make_tuple (i,MazeMatrix.at(i).size()-1);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(i,MazeMatrix.at(i).size()-1);
            }
        }
    }
    //checking top and bottom
    for(int i = 0; i < MazeMatrix.at(0).size(); i++){
        if(MazeMatrix.at(0).at(i) == '0'){
            if(!startFound){
                startCell = std::make_tuple (0, i);
                startFound = true;
            }
            else{
                endCell = std::make_tuple(0, i);
            }
        }
        if(MazeMatrix.at(MazeMatrix.size() -1).at(i) == '0'){
            if(!startFound){
                startCell = std::make_tuple(MazeMatrix.size()-1, i);
                startFound = true;
            }
            else {
                endCell = std::make_tuple(MazeMatrix.size() - 1, i);
            }

        }

    }
 }